

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O3

void set_style_array(Am_Style *arg0,Am_Style *arg1,Am_Style *arg2,Am_Style *arg3,Am_Style *arg4,
                    Am_Style *arg5,Am_Style *arg6,Am_Style *arg7)

{
  Am_Style::operator=((Am_Style *)style_array,arg0);
  Am_Style::operator=((Am_Style *)(style_array + 8),arg1);
  Am_Style::operator=((Am_Style *)(style_array + 0x10),arg2);
  Am_Style::operator=((Am_Style *)(style_array + 0x18),arg3);
  Am_Style::operator=((Am_Style *)(style_array + 0x20),arg4);
  Am_Style::operator=((Am_Style *)(style_array + 0x28),arg5);
  Am_Style::operator=((Am_Style *)(style_array + 0x30),arg6);
  Am_Style::operator=((Am_Style *)(style_array + 0x38),arg7);
  return;
}

Assistant:

void
set_style_array(Am_Style arg0 = Am_No_Style, Am_Style arg1 = Am_No_Style,
                Am_Style arg2 = Am_No_Style, Am_Style arg3 = Am_No_Style,
                Am_Style arg4 = Am_No_Style, Am_Style arg5 = Am_No_Style,
                Am_Style arg6 = Am_No_Style, Am_Style arg7 = Am_No_Style)
{
  style_array[0] = arg0;
  style_array[1] = arg1;
  style_array[2] = arg2;
  style_array[3] = arg3;
  style_array[4] = arg4;
  style_array[5] = arg5;
  style_array[6] = arg6;
  style_array[7] = arg7;
}